

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_BRAND_BOLTS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  _Bool used;
  wchar_t itemmode;
  char *s;
  char *q;
  object *obj;
  effect_handler_context_t_conflict *context_local;
  
  context->ident = true;
  obj = (object *)context;
  if (context->cmd == (command_conflict *)0x0) {
    _Var1 = get_item((object **)&q,"Brand which bolts? ","You have no bolts to brand.",CMD_NULL,
                     tval_is_bolt,L'\x0e');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar2 = cmd_get_item((command *)context->cmd,"tgtitem",(object **)&q,"Brand which bolts? ",
                         "You have no bolts to brand.",tval_is_bolt,L'\x0e');
    if (wVar2 != L'\0') {
      return false;
    }
  }
  brand_object((object *)q,"Flame");
  return true;
}

Assistant:

bool effect_handler_BRAND_BOLTS(effect_handler_context_t *context)
{
	struct object *obj;
	const char *q, *s;
	int itemmode = (USE_INVEN | USE_QUIVER | USE_FLOOR);
	bool used = false;

	context->ident = true;

	/* Get an item */
	q = "Brand which bolts? ";
	s = "You have no bolts to brand.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				tval_is_bolt, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, tval_is_bolt, itemmode))
		return used;

	/* Brand the bolts */
	brand_object(obj, "Flame");

	/* Done */
	return (true);
}